

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<bool,_std::allocator<bool>_> *vec)

{
  uint uVar1;
  _Bit_type *p_Var2;
  ostream *poVar3;
  uint uVar4;
  _Bit_type *p_Var5;
  bool bVar6;
  
  p_Var5 = (vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  p_Var2 = (vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (vec->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  uVar4 = 0;
  while ((p_Var5 != p_Var2 || (uVar4 != uVar1))) {
    poVar3 = std::ostream::_M_insert<bool>(SUB81(os,0));
    std::operator<<(poVar3,", ");
    bVar6 = uVar4 == 0x3f;
    uVar4 = uVar4 + 1;
    p_Var5 = p_Var5 + bVar6;
    if (bVar6) {
      uVar4 = 0;
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}